

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

sexp_conflict
sexp_hash_table_cell
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict ht,sexp_conflict obj,
          sexp_conflict createp)

{
  uint uVar1;
  sexp_conflict psVar2;
  sexp_conflict psVar3;
  sexp psVar4;
  sexp_conflict psVar5;
  undefined8 uVar6;
  long lVar7;
  sexp psVar8;
  int *piVar9;
  ulong uVar10;
  sexp_conflict newbuckets;
  int oldsize;
  sexp_conflict local_88;
  sexp_conflict local_80;
  sexp_conflict local_78;
  sexp local_70;
  sexp_conflict local_68;
  ulong local_60;
  ulong local_58;
  sexp_gc_var_t local_50;
  sexp_gc_var_t local_40;
  
  if (((ulong)ht & 3) == 0) {
    psVar8 = (ht->value).type.name;
    psVar2 = (ht->value).type.slots;
    psVar5 = (ht->value).type.getters;
    local_78 = createp;
    psVar3 = sexp_get_bucket(ctx,(psVar8->value).type.name,psVar2,obj);
    lVar7 = (long)psVar3 >> 1;
    local_88 = sexp_scan_bucket(ctx,*(sexp_conflict *)((long)&psVar8->value + lVar7 * 8 + 8),obj,
                                psVar5);
    if (local_88 == (sexp_conflict)0x3e) {
      if (local_78 == (sexp_conflict)0x3e) {
        local_88 = (sexp_conflict)0x3e;
      }
      else {
        local_50.var = &local_88;
        local_50.next = (ctx->value).context.saves;
        (ctx->value).context.saves = &local_50;
        local_58 = (ht->value).fileno.fd;
        uVar10 = (psVar8->value).stack.length;
        local_80 = obj;
        local_70 = psVar8;
        if (uVar10 >> 2 < (ulong)(((long)local_58 >> 1) * 3)) {
          local_40.var = &local_68;
          local_68 = (sexp_conflict)0x43e;
          (ctx->value).context.saves = &local_40;
          local_60 = uVar10;
          local_40.next = &local_50;
          psVar4 = (sexp)sexp_make_vector_op(ctx,0,2,(long)((int)uVar10 * 2) * 2 + 1,0x23e);
          local_68 = psVar4;
          if ((psVar4 != (sexp)0x0) && ((((ulong)psVar4 & 3) != 0 || (psVar4->tag != 0x13)))) {
            uVar1 = (uint)local_60;
            if (0 < (int)uVar1) {
              uVar10 = 0;
              do {
                for (piVar9 = *(int **)((long)&psVar8->value + uVar10 * 8 + 8);
                    (((ulong)piVar9 & 3) == 0 && (*piVar9 == 6)); piVar9 = *(int **)(piVar9 + 4)) {
                  psVar5 = sexp_get_bucket(ctx,(local_68->value).type.name,psVar2,
                                           *(sexp_conflict *)(*(long *)(piVar9 + 2) + 8));
                  sexp_push_op(ctx,(long)&psVar4->value + (long)(int)((ulong)psVar5 >> 1) * 8 + 8,
                               *(undefined8 *)(piVar9 + 2));
                }
                uVar10 = uVar10 + 1;
                psVar8 = local_70;
              } while (uVar10 != (uVar1 & 0x7fffffff));
            }
            (ht->value).type.name = local_68;
          }
          obj = local_80;
          (ctx->value).context.saves = local_40.next;
          psVar8 = (ht->value).type.name;
          psVar2 = sexp_get_bucket(ctx,(psVar8->value).type.name,psVar2,local_80);
          lVar7 = (long)psVar2 >> 1;
        }
        local_88 = (sexp_conflict)sexp_cons_op(ctx,0,2,obj,local_78);
        uVar6 = sexp_cons_op(ctx,0,2,local_88,*(undefined8 *)((long)&psVar8->value + lVar7 * 8 + 8))
        ;
        *(undefined8 *)((long)&psVar8->value + lVar7 * 8 + 8) = uVar6;
        (ht->value).type.cpl = (sexp)((local_58 | 1) + 2);
        (ctx->value).context.saves = local_50.next;
      }
    }
    else {
      local_88 = (sexp_conflict)(local_88->value).flonum;
    }
    return local_88;
  }
  psVar2 = (sexp_conflict)sexp_xtype_exception(ctx,self,"not a Hash-Table");
  return psVar2;
}

Assistant:

sexp sexp_hash_table_cell (sexp ctx, sexp self, sexp_sint_t n, sexp ht, sexp obj, sexp createp) {
  sexp buckets, eq_fn, hash_fn, i;
  sexp_uint_t size;
  sexp_gc_var1(res);
  /* extra check - exact type should be checked by the calling procedure */
  if (! sexp_pointerp(ht))
    return sexp_xtype_exception(ctx, self, "not a Hash-Table", ht);
  buckets = sexp_hash_table_buckets(ht);
  eq_fn = sexp_hash_table_eq_fn(ht);
  hash_fn = sexp_hash_table_hash_fn(ht);
  i = sexp_get_bucket(ctx, buckets, hash_fn, obj);
  res = sexp_scan_bucket(ctx, sexp_vector_ref(buckets, i), obj, eq_fn);
  if (sexp_truep(res)) {
    res = sexp_car(res);
  } else if (sexp_truep(createp)) {
    sexp_gc_preserve1(ctx, res);
    size = sexp_unbox_fixnum(sexp_hash_table_size(ht));
    if (sexp_hash_resize_check(size, sexp_vector_length(buckets))) {
      sexp_regrow_hash_table(ctx, ht, buckets, hash_fn);
      buckets = sexp_hash_table_buckets(ht);
      i = sexp_get_bucket(ctx, buckets, hash_fn, obj);
    }
    res = sexp_cons(ctx, obj, createp);
    sexp_vector_set(buckets, i, sexp_cons(ctx, res, sexp_vector_ref(buckets, i)));
    sexp_hash_table_size(ht) = sexp_make_fixnum(size+1);
    sexp_gc_release1(ctx);
  }
  return res;
}